

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O1

QSize __thiscall QDockWidgetGroupWindowItem::minimumSize(QDockWidgetGroupWindowItem *this)

{
  int iVar1;
  QWidget *this_00;
  QSize QVar2;
  undefined4 extraout_var;
  QLayout *pQVar3;
  
  iVar1 = (*(this->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
  this_00 = (QWidget *)qt_qFindChild_helper(iVar1,0,0,&QDockWidget::staticMetaObject,1);
  if (this_00 == (QWidget *)0x0) {
    iVar1 = (*(this->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])(this);
    pQVar3 = QWidget::layout((QWidget *)CONCAT44(extraout_var,iVar1));
    QVar2 = (QSize)(**(code **)(*(long *)pQVar3 + 0x90))(pQVar3);
    return QVar2;
  }
  QVar2 = QWidget::minimumSize(this_00);
  return QVar2;
}

Assistant:

QSize minimumSize() const override
    {
        if (auto dw = widget()->findChild<QDockWidget *>())
            return dw->minimumSize();
        return lay()->minimumSize();
    }